

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_heavy.cc
# Opt level: O1

MessageLite * __thiscall
google::protobuf::internal::ExtensionSet::ReleaseMessage
          (ExtensionSet *this,FieldDescriptor *descriptor,MessageFactory *factory)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  LogMessage *pLVar3;
  undefined4 extraout_var;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_std::_Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>_>
  pVar6;
  key_type local_a4;
  LogMessage local_a0;
  LogMessage local_68;
  undefined4 extraout_var_00;
  
  iVar2 = *(int *)(descriptor + 0x28);
  p_Var1 = &(this->extensions_)._M_t._M_impl.super__Rb_tree_header;
  p_Var5 = (this->extensions_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var4 = &p_Var1->_M_header;
  for (; p_Var5 != (_Base_ptr)0x0; p_Var5 = (&p_Var5->_M_left)[(int)p_Var5[1]._M_color < iVar2]) {
    if (iVar2 <= (int)p_Var5[1]._M_color) {
      p_Var4 = p_Var5;
    }
  }
  p_Var5 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var4 != p_Var1) && (p_Var5 = p_Var4, iVar2 < (int)p_Var4[1]._M_color)) {
    p_Var5 = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)p_Var5 == p_Var1) {
    p_Var4 = (_Base_ptr)0x0;
  }
  else {
    if (*(char *)((long)&p_Var5[1]._M_left + 1) == '\x01') {
      LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/extension_set_heavy.cc"
                 ,0xab);
      pLVar3 = LogMessage::operator<<
                         (&local_68,
                          "CHECK failed: ((iter->second).is_repeated ? FieldDescriptor::LABEL_REPEATED : FieldDescriptor::LABEL_OPTIONAL) == (FieldDescriptor::LABEL_OPTIONAL): "
                         );
      LogFinisher::operator=((LogFinisher *)&local_a0,pLVar3);
      LogMessage::~LogMessage(&local_68);
    }
    if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(byte *)&p_Var5[1]._M_left * 4) != 10)
    {
      LogMessage::LogMessage
                (&local_a0,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/extension_set_heavy.cc"
                 ,0xab);
      pLVar3 = LogMessage::operator<<
                         (&local_a0,
                          "CHECK failed: (cpp_type((iter->second).type)) == (FieldDescriptor::CPPTYPE_MESSAGE): "
                         );
      LogFinisher::operator=((LogFinisher *)&local_a4,pLVar3);
      LogMessage::~LogMessage(&local_a0);
    }
    p_Var4 = p_Var5[1]._M_parent;
    if (((ulong)p_Var5[1]._M_left & 0x100000) != 0) {
      iVar2 = (*factory->_vptr_MessageFactory[2])(factory,*(undefined8 *)(descriptor + 0x48));
      iVar2 = (*(*(_func_int ***)p_Var4)[6])(p_Var4,CONCAT44(extraout_var,iVar2));
      p_Var4 = (_Base_ptr)CONCAT44(extraout_var_00,iVar2);
      if (p_Var5[1]._M_parent != (_Base_ptr)0x0) {
        (**(code **)(*(long *)p_Var5[1]._M_parent + 8))();
      }
    }
    local_a4 = *(key_type *)(descriptor + 0x28);
    pVar6 = std::
            _Rb_tree<int,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>,_std::_Select1st<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>_>
            ::equal_range((_Rb_tree<int,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>,_std::_Select1st<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>_>
                           *)this,&local_a4);
    std::
    _Rb_tree<int,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>,_std::_Select1st<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>_>
    ::_M_erase_aux((_Rb_tree<int,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>,_std::_Select1st<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>_>
                    *)this,(_Base_ptr)pVar6.first._M_node,(_Base_ptr)pVar6.second._M_node);
  }
  return (MessageLite *)p_Var4;
}

Assistant:

MessageLite* ExtensionSet::ReleaseMessage(const FieldDescriptor* descriptor,
                                          MessageFactory* factory) {
  map<int, Extension>::iterator iter = extensions_.find(descriptor->number());
  if (iter == extensions_.end()) {
    // Not present.  Return NULL.
    return NULL;
  } else {
    GOOGLE_DCHECK_TYPE(iter->second, OPTIONAL, MESSAGE);
    MessageLite* ret = NULL;
    if (iter->second.is_lazy) {
      ret = iter->second.lazymessage_value->ReleaseMessage(
        *factory->GetPrototype(descriptor->message_type()));
      delete iter->second.lazymessage_value;
    } else {
      ret = iter->second.message_value;
    }
    extensions_.erase(descriptor->number());
    return ret;
  }
}